

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderApiTests.cpp
# Opt level: O0

void deqp::gles31::Functional::NegativeTestShared::get_sampler_parameterfv(NegativeTestContext *ctx)

{
  NegativeTestContext *pNVar1;
  allocator<char> local_71;
  string local_70;
  allocator<char> local_39;
  string local_38;
  GLuint local_18;
  GLfloat local_14;
  GLuint sampler;
  float params;
  NegativeTestContext *ctx_local;
  
  local_14 = 0.0;
  local_18 = 0;
  _sampler = ctx;
  glu::CallLogWrapper::glGenSamplers(&ctx->super_CallLogWrapper,1,&local_18);
  pNVar1 = _sampler;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,
             "GL_INVALID_OPERATION is generated if sampler is not the name of a sampler object returned from a previous call to ctx.glGenSamplers."
             ,&local_39);
  NegativeTestContext::beginSection(pNVar1,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  glu::CallLogWrapper::glGetSamplerParameterfv
            (&_sampler->super_CallLogWrapper,0xffffffff,0x2800,&local_14);
  NegativeTestContext::expectError(_sampler,0x502);
  NegativeTestContext::endSection(_sampler);
  pNVar1 = _sampler;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"GL_INVALID_ENUM is generated if pname is not an accepted value.",
             &local_71);
  NegativeTestContext::beginSection(pNVar1,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  glu::CallLogWrapper::glGetSamplerParameterfv
            (&_sampler->super_CallLogWrapper,local_18,0xffffffff,&local_14);
  NegativeTestContext::expectError(_sampler,0x500);
  NegativeTestContext::endSection(_sampler);
  glu::CallLogWrapper::glDeleteSamplers(&_sampler->super_CallLogWrapper,1,&local_18);
  return;
}

Assistant:

void get_sampler_parameterfv (NegativeTestContext& ctx)
{
	float				params	= 0.0f;
	GLuint				sampler = 0;
	ctx.glGenSamplers	(1, &sampler);

	ctx.beginSection("GL_INVALID_OPERATION is generated if sampler is not the name of a sampler object returned from a previous call to ctx.glGenSamplers.");
	ctx.glGetSamplerParameterfv	(-1, GL_TEXTURE_MAG_FILTER, &params);
	ctx.expectError			(GL_INVALID_OPERATION);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_ENUM is generated if pname is not an accepted value.");
	ctx.glGetSamplerParameterfv	(sampler, -1, &params);
	ctx.expectError			(GL_INVALID_ENUM);
	ctx.endSection();

	ctx.glDeleteSamplers(1, &sampler);
}